

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall
CLI::Range::Range<double>(Range *this,double min_val,double max_val,string *validator_name)

{
  ostream *poVar1;
  stringstream out;
  string local_1e0;
  string local_1c0;
  anon_class_16_2_ee34707b local_1a0;
  ostream local_190 [376];
  
  ::std::__cxx11::string::string((string *)&local_1c0,(string *)validator_name);
  Validator::Validator(&this->super_Validator,&local_1c0);
  ::std::__cxx11::string::~string((string *)&local_1c0);
  if (validator_name->_M_string_length == 0) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
    poVar1 = ::std::operator<<(local_190,"FLOAT");
    ::std::operator<<(poVar1," in [");
    poVar1 = ::std::ostream::_M_insert<double>(min_val);
    ::std::operator<<(poVar1," - ");
    poVar1 = ::std::ostream::_M_insert<double>(max_val);
    ::std::operator<<(poVar1,"]");
    ::std::__cxx11::stringbuf::str();
    Validator::description(&this->super_Validator,&local_1e0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  }
  local_1a0.min_val = min_val;
  local_1a0.max_val = max_val;
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,&local_1a0);
  return;
}

Assistant:

Range(T min_val, T max_val, const std::string &validator_name = std::string{}) : Validator(validator_name) {
        if(validator_name.empty()) {
            std::stringstream out;
            out << detail::type_name<T>() << " in [" << min_val << " - " << max_val << "]";
            description(out.str());
        }

        func_ = [min_val, max_val](std::string &input) {
            using CLI::detail::lexical_cast;
            T val;
            bool converted = lexical_cast(input, val);
            if((!converted) || (val < min_val || val > max_val)) {
                std::stringstream out;
                out << "Value " << input << " not in range [";
                out << min_val << " - " << max_val << "]";
                return out.str();
            }
            return std::string{};
        };
    }